

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O3

void PrintFunction(InstructionVMGraphContext *ctx,VmFunction *function)

{
  uint uVar1;
  VmValueType VVar2;
  FunctionData *pFVar3;
  ArgumentData *pAVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ModuleData *pMVar9;
  ScopeData *pSVar10;
  VariableData *pVVar11;
  char *pcVar12;
  VmConstant *pVVar13;
  VmValue *value;
  VmConstant *pVVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  VmBlock *block;
  
  pFVar3 = function->function;
  if (pFVar3 != (FunctionData *)0x0) {
    if ((pFVar3->importModule == (ModuleData *)0x0) || ((function->super_VmValue).users.count != 0))
    {
      PrintUsers(ctx,&function->super_VmValue,true);
      Print(ctx,"function ");
      PrintType(ctx,function->returnType);
      pcVar18 = (pFVar3->name->name).begin;
      Print(ctx," %.*s.f%04x(",(ulong)(uint)(*(int *)&(pFVar3->name->name).end - (int)pcVar18),
            pcVar18,(ulong)pFVar3->uniqueId);
      if ((pFVar3->arguments).count != 0) {
        lVar21 = 0;
        uVar23 = 0;
        do {
          pAVar4 = (pFVar3->arguments).data;
          pcVar18 = ", ";
          if (lVar21 == 0) {
            pcVar18 = "";
          }
          pcVar16 = "";
          if ((&pAVar4->isExplicit)[lVar21] != false) {
            pcVar16 = "explicit ";
          }
          lVar5 = *(long *)((long)&pAVar4->name + lVar21);
          lVar6 = *(long *)((long)&pAVar4->type + lVar21);
          uVar7 = *(undefined8 *)(lVar6 + 0x10);
          uVar8 = *(undefined8 *)(lVar5 + 0x40);
          Print(ctx,"%s%s%.*s %.*s",pcVar18,pcVar16,
                (ulong)(uint)(*(int *)(lVar6 + 0x18) - (int)uVar7),uVar7,
                (ulong)(uint)(*(int *)(lVar5 + 0x48) - (int)uVar8),uVar8);
          uVar23 = uVar23 + 1;
          lVar21 = lVar21 + 0x30;
        } while (uVar23 < (pFVar3->arguments).count);
      }
      pcVar18 = "";
      if (function->firstBlock == (VmBlock *)0x0) {
        pcVar18 = ";";
      }
      Print(ctx,")%s",pcVar18);
      pMVar9 = pFVar3->importModule;
      if (pMVar9 != (ModuleData *)0x0) {
        Print(ctx," from \'%.*s\'",
              (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin));
      }
      OutputContext::Print(ctx->output,"\n",1);
      if (function->firstBlock != (VmBlock *)0x0) goto LAB_001c56a7;
    }
    return;
  }
  PrintLine(ctx,"function global()");
LAB_001c56a7:
  pSVar10 = function->scope;
  if ((pSVar10 != (ScopeData *)0x0) && (uVar15 = (pSVar10->allVariables).count, uVar15 != 0)) {
    uVar23 = 0;
    do {
      pVVar11 = (pSVar10->allVariables).data[uVar23];
      if ((pVVar11->isAlloca != true) || ((pVVar11->users).count != 0)) {
        pcVar18 = "imported ";
        if (pVVar11->importModule == (ModuleData *)0x0) {
          pcVar18 = "";
        }
        pcVar16 = (pVVar11->type->name).begin;
        pcVar12 = (pVVar11->name->name).begin;
        Print(ctx,"// %s0x%x: %.*s %.*s",pcVar18,(ulong)pVVar11->offset,
              (ulong)(uint)(*(int *)&(pVVar11->type->name).end - (int)pcVar16),pcVar16,
              (ulong)(uint)(*(int *)&(pVVar11->name->name).end - (int)pcVar12),pcVar12);
        if (ctx->showUsers == true) {
          Print(ctx," [");
        }
        uVar15 = (pVVar11->users).count;
        if (uVar15 == 0) {
          bVar20 = false;
        }
        else {
          uVar24 = 0;
          bVar20 = false;
          do {
            pVVar13 = (pVVar11->users).data[uVar24];
            uVar1 = (pVVar13->super_VmValue).users.count;
            uVar17 = (ulong)uVar1;
            if (uVar1 != 0) {
              uVar22 = 0;
              bVar19 = bVar20;
              do {
                if (((int)uVar22 != 0 || (int)uVar24 != 0) && (ctx->showUsers != false)) {
                  Print(ctx,", ");
                  uVar17 = (ulong)(pVVar13->super_VmValue).users.count;
                }
                if (uVar17 <= uVar22) {
                  pcVar18 = 
                  "T &SmallArray<VmValue *, 8>::operator[](unsigned int) [T = VmValue *, N = 8]";
                  goto LAB_001c5a47;
                }
                value = (pVVar13->super_VmValue).users.data[uVar22];
                if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                                ,0x2b3,
                                "void PrintFunction(InstructionVMGraphContext &, VmFunction *)");
                }
                if (ctx->showUsers == true) {
                  PrintName(ctx,value,(VmFunction *)value[1].users.data[0x16] != function,true);
                }
                uVar15 = *(uint *)&value[1]._vptr_VmValue;
                if (uVar15 < 7) {
LAB_001c581a:
                  bVar20 = bVar19;
                }
                else {
                  if ((uVar15 - 8 < 7) || (uVar15 == 0x1a)) {
                    if (value[1].type.type == VM_TYPE_VOID) goto LAB_001c5a32;
                    pVVar14 = (VmConstant *)**(long **)&value[1].typeID;
joined_r0x001c5879:
                    bVar20 = true;
                    if (pVVar14 != pVVar13) goto LAB_001c587b;
                    goto LAB_001c581a;
                  }
                  if (uVar15 == 0x1b) {
                    VVar2 = value[1].type.type;
                    if (VVar2 != VM_TYPE_VOID) {
                      if ((VmConstant *)**(long **)&value[1].typeID == pVVar13) goto LAB_001c581a;
                      if (VM_TYPE_DOUBLE < VVar2) {
                        pVVar14 = (VmConstant *)(*(long **)&value[1].typeID)[2];
                        goto joined_r0x001c5879;
                      }
                    }
LAB_001c5a32:
                    pcVar18 = 
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]";
LAB_001c5a47:
                    __assert_fail("index < count",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                  ,0x199,pcVar18);
                  }
                  if (uVar15 - 0x1f < 2) {
                    bVar20 = true;
                    if (pVVar13->isReference == true) goto LAB_001c581a;
                  }
                  else {
                    bVar20 = true;
                    if (uVar15 - 0x33 < 0x11) {
                      if (value[1].type.type < VM_TYPE_DOUBLE) goto LAB_001c5a32;
                      if (*(VmConstant **)(*(long *)&value[1].typeID + 8) == pVVar13)
                      goto LAB_001c581a;
                    }
                  }
                }
LAB_001c587b:
                uVar22 = uVar22 + 1;
                uVar17 = (ulong)(pVVar13->super_VmValue).users.count;
                bVar19 = bVar20;
              } while (uVar22 < uVar17);
              uVar15 = (pVVar11->users).count;
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 < uVar15);
        }
        if (ctx->showUsers != false) {
          Print(ctx,"]");
        }
        if (!bVar20) {
          Print(ctx," noalias");
        }
        if (pVVar11->isAlloca == true) {
          Print(ctx," alloca");
        }
        pMVar9 = pVVar11->importModule;
        if (pMVar9 != (ModuleData *)0x0) {
          Print(ctx," from \'%.*s\'",
                (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin));
        }
        OutputContext::Print(ctx->output,"\n",1);
        uVar15 = (pSVar10->allVariables).count;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar15);
  }
  PrintLine(ctx,"{");
  for (block = function->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
    PrintBlock(ctx,block);
  }
  PrintLine(ctx,"}");
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintFunction(InstructionVMGraphContext &ctx, VmFunction *function)
{
	if(FunctionData *fData = function->function)
	{
		if(fData->importModule != NULL && function->users.empty())
			return;

		PrintUsers(ctx, function, true);

		Print(ctx, "function ");
		PrintType(ctx, function->returnType);
		Print(ctx, " %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		Print(ctx, ")%s", function->firstBlock == NULL ? ";" : "");

		if(fData->importModule)
			Print(ctx, " from '%.*s'", FMT_ISTR(fData->importModule->name));

		PrintLine(ctx);

		if(function->firstBlock == NULL)
			return;
	}
	else
	{
		PrintLine(ctx, "function global()");
	}

	if(ScopeData *scope = function->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			if(ctx.showUsers)
				Print(ctx, " [");

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(ctx.showUsers)
					{
						if(i != 0 || k != 0)
							Print(ctx, ", ");
					}

					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						if(ctx.showUsers)
							PrintName(ctx, inst, inst->parent->parent != function, true);

						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
						{
							simpleUse = true;
						}
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
						{
							if(user->isReference)
								simpleUse = true;
							else
								simpleUse = false;
						}
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
						{
							simpleUse = true;
						}
						else
						{
							simpleUse = false;
						}

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(ctx.showUsers)
				Print(ctx, "]");

			if(!addressTaken)
				Print(ctx, " noalias");

			if(variable->isAlloca)
				Print(ctx, " alloca");

			if(variable->importModule)
				Print(ctx, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx);
		}
	}

	PrintLine(ctx, "{");

	for(VmBlock *value = function->firstBlock; value; value = value->nextSibling)
		PrintBlock(ctx, value);
	
	PrintLine(ctx, "}");
	PrintLine(ctx);
}